

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fastsin.cpp
# Opt level: O0

double __thiscall FFastTrig::sin(FFastTrig *this,double __x)

{
  uint in_ESI;
  double dVar1;
  uint bangle_local;
  FFastTrig *this_local;
  
  if ((in_ESI & 0xc0000000) == 0xc0000000) {
    dVar1 = sinq1(this,-in_ESI);
    this_local = (FFastTrig *)((ulong)dVar1 ^ 0x8000000000000000);
  }
  else if ((in_ESI & 0xc0000000) == 0x40000000) {
    this_local = (FFastTrig *)sinq1(this,0x80000000 - in_ESI);
  }
  else {
    this_local = (FFastTrig *)sinq1(this,in_ESI);
  }
  return (double)this_local;
}

Assistant:

double FFastTrig::sin(unsigned bangle)
{
	switch (bangle & 0xc0000000)
	{
	default:
		return sinq1(bangle);

	case 0x40000000:
		return sinq1(0x80000000 - bangle);

	case 0x80000000:
		return -sinq1(bangle - 0x80000000);

	case 0xc0000000:
		return -sinq1(0 - bangle);
	}
}